

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O3

void * tommy_tree_search_compare(tommy_tree *tree,tommy_compare_func *cmp,void *cmp_arg)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  tommy_tree_node *ptVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar4 = tree->root;
  if (ptVar4 == (tommy_tree_node *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = (void *)0x0;
    do {
      iVar2 = (*cmp)(cmp_arg,ptVar4->data);
      if (iVar2 < 0) {
        ptVar4 = (tommy_tree_node *)&ptVar4->prev;
      }
      else if (iVar2 == 0) {
        pvVar3 = ptVar4->data;
        break;
      }
      ptVar4 = ptVar4->next;
    } while (ptVar4 != (tommy_node_struct *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pvVar3;
}

Assistant:

void* tommy_tree_search_compare(tommy_tree* tree, tommy_compare_func* cmp, void* cmp_arg)
{
	tommy_tree_node* node = tommy_tree_search_node(cmp, tree->root, cmp_arg);

	if (!node)
		return 0;

	return node->data;
}